

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmuuidgen.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte_t *pbVar1;
  char *pcVar2;
  uint local_84;
  ui32_t i;
  byte_t *p;
  char uuid_buf [40];
  undefined1 local_40 [8];
  UUID UUID;
  CommandOptions Options;
  char **argv_local;
  int argc_local;
  
  CommandOptions::CommandOptions((CommandOptions *)&UUID.super_Identifier<16U>.field_0x1a,argc,argv)
  ;
  if ((UUID.super_Identifier<16U>._29_1_ & 1) != 0) {
    banner((FILE *)_stdout);
  }
  if ((UUID.super_Identifier<16U>._30_1_ & 1) != 0) {
    usage((FILE *)_stdout);
  }
  if (((UUID.super_Identifier<16U>._29_1_ & 1) == 0) &&
     ((UUID.super_Identifier<16U>._30_1_ & 1) == 0)) {
    if ((UUID.super_Identifier<16U>._26_1_ & 1) == 0) {
      Kumu::UUID::UUID((UUID *)local_40);
      Kumu::GenRandomValue((UUID *)local_40);
      if ((UUID.super_Identifier<16U>._28_1_ & 1) == 0) {
        pcVar2 = Kumu::UUID::EncodeHex((UUID *)local_40,(char *)&p,0x28);
        fputs(pcVar2,_stdout);
        if ((UUID.super_Identifier<16U>._27_1_ & 1) == 0) {
          printf("\n");
        }
      }
      else {
        pbVar1 = Kumu::Identifier<16U>::Value((Identifier<16U> *)local_40);
        pcVar2 = Kumu::UUID::EncodeHex((UUID *)local_40,(char *)&p,0x28);
        printf("byte_t uuid_buf[16] = {\n  // %s\n ",pcVar2);
        for (local_84 = 0; local_84 < 0x10; local_84 = local_84 + 1) {
          printf(" 0x%02x,",(ulong)pbVar1[local_84]);
        }
        printf("\n");
        printf("};\n");
      }
      argv_local._4_4_ = 0;
      Kumu::UUID::~UUID((UUID *)local_40);
    }
    else {
      fprintf(_stderr,"There was a problem. Type %s -h for help.\n",PROGRAM_NAME);
      argv_local._4_4_ = 3;
    }
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

   if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  Kumu::UUID UUID;
  Kumu::GenRandomValue(UUID);
  char uuid_buf[40];

  if ( Options.c_array_flag )
    {
      const byte_t* p = UUID.Value();

      printf("\
byte_t uuid_buf[16] = {\n\
  // %s\n ",
	     UUID.EncodeHex(uuid_buf, 40));
	  
      for ( ui32_t i = 0; i < 16; i++ )
	printf(" 0x%02x,", p[i]);

      printf("\n");
      printf("};\n");
      return 0;
    }
  else
    {
      fputs(UUID.EncodeHex(uuid_buf, 40), stdout);
    }

  if ( Options.no_newline_flag == 0 )
    printf("\n");

  return 0;
}